

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int fm_handler(chmgr *chmgr,uint8_t *fm,uint16_t size)

{
  uint8_t *buf;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  ulong in_RAX;
  int *piVar6;
  uint16_t len;
  undefined6 in_register_00000012;
  undefined8 *payload;
  uint uVar7;
  char *__fmt;
  uint8_t fn;
  ulong __n;
  undefined8 local_38;
  
  payload = &local_38;
  uVar2 = *(ushort *)(fm + 1);
  __n = (ulong)uVar2;
  uVar7 = (uint)uVar2;
  if ((int)CONCAT62(in_register_00000012,size) - 5U != uVar7) {
    if (((byte)loglevel & 1) == 0) goto LAB_0010340d;
    __fmt = "The data length does not match len = %d, size = %d\n";
LAB_00103406:
    syslog(3,__fmt,(ulong)uVar7);
LAB_0010340d:
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    return -1;
  }
  uVar3 = *(ushort *)(fm + __n + 3);
  local_38 = in_RAX;
  uVar4 = calc_crc(fm,uVar2 + 3);
  uVar7 = (uint)uVar3;
  if (uVar7 != uVar4) {
    if (((byte)loglevel & 1) == 0) goto LAB_0010340d;
    __fmt = "crc{%04x, %04x} does not match\n";
    goto LAB_00103406;
  }
  bVar1 = *fm;
  if (0x82 < bVar1 - 1) goto switchD_00103356_caseD_1f;
  buf = fm + 3;
  switch((uint)bVar1) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
    if (chmgr->fds[bVar1].fd < 1) {
      iVar5 = load_shell(chmgr->shell);
      chmgr->fds[bVar1].fd = iVar5;
      chmgr->cbs[bVar1] = logical_channel_cb;
      if (iVar5 < 0) break;
      chmgr->fds[bVar1].events = 1;
    }
    write(chmgr->fds[bVar1].fd,buf,__n);
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
    local_38._0_5_ = CONCAT41(*(undefined4 *)(fm + 3),1);
    if (-1 < chmgr->fd) {
      local_38 = local_38 & 0xffffffffffffff00;
      lseek(chmgr->fd,(ulong)*(uint *)(fm + 3),0);
      write(chmgr->fd,fm + 7,__n - 4);
    }
    fn = bVar1 + 0x20;
    uVar4 = 5;
    goto LAB_001033cb;
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    if (((fm[3] == '\0') && (chmgr->ftmgr != (ftmgr *)0x0)) &&
       (iVar5 = ftmgr_aeq_handle(chmgr->ftmgr,bVar1 - 0x40,fm + 4), iVar5 == 0)) {
      free_ftmgr(&chmgr->ftmgr);
      close_pty(chmgr->prefix,chmgr->fds[0].fd,0);
      iVar5 = open_pty(chmgr->prefix,0);
      chmgr->fds[0].fd = iVar5;
    }
    break;
  case 0x80:
    handle_fstat_req(chmgr,buf,len);
    break;
  case 0x81:
    handle_fstat_rsp(chmgr,*buf);
    break;
  case 0x82:
    if (chmgr->fd != 0) {
      close(chmgr->fd);
    }
    chmgr->fd = -1;
    break;
  case 0x83:
    fn = 0x84;
    payload = (undefined8 *)0x0;
    uVar4 = 0;
LAB_001033cb:
    fm_write(chmgr,fn,payload,uVar4);
  }
switchD_00103356_caseD_1f:
  chmgr->heartbeat = 0x14;
  return 0;
}

Assistant:

static int fm_handler(struct chmgr *chmgr, const uint8_t *fm, uint16_t size)
{
    uint16_t len;
    uint16_t crc1 = 0, crc2 = 0;
    len = STREAM_TO_U16(fm + 1);
    if(len != size - 5) {
        LOGE("The data length does not match len = %d, size = %d\n", len, size);
        errno = EINVAL;
        return -1;
    }

    crc1 = STREAM_TO_U16(fm + FM_HDR_SIZE + len);
    crc2 = calc_crc(fm, FM_HDR_SIZE + len);
    if(crc1 !=  crc2) {
        LOGE("crc{%04x, %04x} does not match\n", crc1, crc2);
        errno = EINVAL;
        return -1;
    }

    chmgr_handler(chmgr, fm[0], len, fm + FM_HDR_SIZE);
    chmgr->heartbeat = 20;
    return 0;
}